

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O1

void __thiscall Clasp::PropagatorList::add(PropagatorList *this,PostPropagator *p)

{
  uint uVar1;
  uint uVar2;
  PostPropagator *pPVar3;
  PostPropagator *pPVar4;
  
  if ((p == (PostPropagator *)0x0) || (p->next != (PostPropagator *)0x0)) {
    Potassco::fail(-2,"void Clasp::PropagatorList::add(PostPropagator *)",0x4a,"p && p->next == 0",
                   "Invalid post propagator",0);
  }
  uVar1 = (*(p->super_Constraint)._vptr_Constraint[0x12])(p);
  pPVar4 = this->head_;
  if (pPVar4 != (PostPropagator *)0x0) {
    uVar2 = (*(pPVar4->super_Constraint)._vptr_Constraint[0x12])(pPVar4);
    if (uVar2 <= uVar1) {
      do {
        pPVar3 = pPVar4;
        pPVar4 = pPVar3->next;
        if (pPVar4 == (PostPropagator *)0x0) break;
        uVar2 = (*(pPVar4->super_Constraint)._vptr_Constraint[0x12])(pPVar4);
      } while (uVar2 <= uVar1);
      this = (PropagatorList *)&pPVar3->next;
    }
  }
  p->next = pPVar4;
  *this = (PropagatorList)p;
  return;
}

Assistant:

void PropagatorList::add(PostPropagator* p) {
	POTASSCO_REQUIRE(p && p->next == 0, "Invalid post propagator");
	uint32 prio = p->priority();
	for (PostPropagator** r = head(), *x;; r = &x->next) {
		if ((x = *r) == 0 || prio < (uint32)x->priority()) {
			p->next = x;
			*r      = p;
			break;
		}
	}
}